

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O0

void __thiscall EmmyDebuggerManager::SetRunning(EmmyDebuggerManager *this,bool value)

{
  bool bVar1;
  reference psVar2;
  element_type *this_00;
  undefined1 local_58 [8];
  shared_ptr<Debugger> debugger;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<Debugger>,_std::allocator<std::shared_ptr<Debugger>_>_> *__range2;
  bool value_local;
  EmmyDebuggerManager *this_local;
  
  std::atomic<bool>::operator=(&this->isRunning,value);
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->isRunning);
  if (bVar1) {
    GetDebuggers((vector<std::shared_ptr<Debugger>,_std::allocator<std::shared_ptr<Debugger>_>_> *)
                 &__begin2,this);
    __end2 = std::vector<std::shared_ptr<Debugger>,_std::allocator<std::shared_ptr<Debugger>_>_>::
             begin((vector<std::shared_ptr<Debugger>,_std::allocator<std::shared_ptr<Debugger>_>_> *
                   )&__begin2);
    debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::vector<std::shared_ptr<Debugger>,_std::allocator<std::shared_ptr<Debugger>_>_>::end
                   ((vector<std::shared_ptr<Debugger>,_std::allocator<std::shared_ptr<Debugger>_>_>
                     *)&__begin2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<Debugger>_*,_std::vector<std::shared_ptr<Debugger>,_std::allocator<std::shared_ptr<Debugger>_>_>_>
                                       *)&debugger.
                                          super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>.
                                          _M_refcount), bVar1) {
      psVar2 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<Debugger>_*,_std::vector<std::shared_ptr<Debugger>,_std::allocator<std::shared_ptr<Debugger>_>_>_>
               ::operator*(&__end2);
      std::shared_ptr<Debugger>::shared_ptr((shared_ptr<Debugger> *)local_58,psVar2);
      this_00 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_58);
      Debugger::Start(this_00);
      std::shared_ptr<Debugger>::~shared_ptr((shared_ptr<Debugger> *)local_58);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Debugger>_*,_std::vector<std::shared_ptr<Debugger>,_std::allocator<std::shared_ptr<Debugger>_>_>_>
      ::operator++(&__end2);
    }
    std::vector<std::shared_ptr<Debugger>,_std::allocator<std::shared_ptr<Debugger>_>_>::~vector
              ((vector<std::shared_ptr<Debugger>,_std::allocator<std::shared_ptr<Debugger>_>_> *)
               &__begin2);
  }
  return;
}

Assistant:

void EmmyDebuggerManager::SetRunning(bool value)
{
	isRunning = value;
	if(isRunning)
	{
		for(auto debugger: GetDebuggers())
		{
			debugger->Start();
		}
	}
}